

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.h
# Opt level: O0

Image get_image_from_grid(Grid *grid)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  Colorf col_00;
  Colorf col_01;
  Colorf col_02;
  Colori CVar4;
  ulong uVar5;
  Image pCVar6;
  GridNode *pGVar7;
  Colorf local_d4;
  Colorf local_c8;
  Colorf local_b4;
  int local_a8;
  int local_a4;
  int index;
  int newX;
  int newY;
  int startY;
  int startX;
  float local_8c;
  Colorf local_88;
  Colorf local_7c;
  Colorf local_70;
  Colorf local_64;
  Colorf local_58;
  Colorf local_4c;
  undefined1 local_40 [8];
  Colorf col;
  NODE_STATE state;
  int x;
  int y;
  Image img;
  int borderSize;
  int size;
  int columns;
  int rows;
  Grid *grid_local;
  
  iVar1 = grid->rows;
  iVar2 = grid->columns;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(iVar1 * 0x3c * iVar2 * 0x3c);
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pCVar6 = (Image)operator_new__(uVar5);
  for (state = EMPTY; (int)state < iVar1; state = state + BLOCKED) {
    for (col.b = 0.0; (int)col.b < iVar2; col.b = (float)((int)col.b + 1)) {
      pGVar7 = Grid::get_node_from_position(grid,(int)col.b,state);
      col.g = (float)pGVar7->state;
      Colorf::Colorf((Colorf *)local_40,0.0);
      switch(col.g) {
      case 0.0:
        Colorf::Colorf(&local_4c,1.0);
        local_40._0_4_ = local_4c.r;
        local_40._4_4_ = local_4c.g;
        col.r = local_4c.b;
        break;
      case 1.4013e-45:
        Colorf::Colorf(&local_58,0.0);
        local_40._0_4_ = local_58.r;
        local_40._4_4_ = local_58.g;
        col.r = local_58.b;
        break;
      case 2.8026e-45:
        Colorf::Colorf(&local_64,0.0,0.0,0.8);
        local_40._0_4_ = local_64.r;
        local_40._4_4_ = local_64.g;
        col.r = local_64.b;
        break;
      case 4.2039e-45:
        Colorf::Colorf(&local_70,0.8,0.0,0.0);
        local_40._0_4_ = local_70.r;
        local_40._4_4_ = local_70.g;
        col.r = local_70.b;
        break;
      case 5.60519e-45:
        Colorf::Colorf(&local_7c,0.0,0.65,0.0);
        local_40._0_4_ = local_7c.r;
        local_40._4_4_ = local_7c.g;
        col.r = local_7c.b;
        break;
      case 7.00649e-45:
        Colorf::Colorf(&local_88,0.75,1.0,0.0);
        local_40._0_4_ = local_88.r;
        local_40._4_4_ = local_88.g;
        col.r = local_88.b;
        break;
      case 8.40779e-45:
        Colorf::Colorf((Colorf *)&startY,1.0);
        local_40._0_4_ = startY;
        local_40._4_4_ = startX;
        col.r = local_8c;
      }
      newY = (int)col.b * 0x3c;
      newX = state * 0x3c;
      for (index = 0; index < 0x3c; index = index + 1) {
        for (local_a4 = 0; local_a4 < 0x3c; local_a4 = local_a4 + 1) {
          local_a8 = (newX + index) * iVar2 * 0x3c + newY + local_a4;
          if ((index < 2) || (0x39 < index)) {
            Colorf::Colorf(&local_b4,0.15);
            local_c8.b = local_b4.b;
            local_c8.r = local_b4.r;
            local_c8.g = local_b4.g;
            col_02.b = local_b4.b;
            col_02.r = local_b4.r;
            col_02.g = local_b4.g;
            CVar4 = get_color(col_02);
            pCVar6[local_a8] = CVar4;
          }
          else if ((local_a4 < 2) || (0x39 < local_a4)) {
            Colorf::Colorf(&local_d4,0.15);
            col_01.b = local_d4.b;
            col_01.r = local_d4.r;
            col_01.g = local_d4.g;
            CVar4 = get_color(col_01);
            pCVar6[local_a8] = CVar4;
          }
          else {
            col_00.b = col.r;
            col_00.r = (float)local_40._0_4_;
            col_00.g = (float)local_40._4_4_;
            CVar4 = get_color(col_00);
            pCVar6[local_a8] = CVar4;
          }
        }
      }
    }
  }
  return pCVar6;
}

Assistant:

Image get_image_from_grid(Grid *grid)
{
    int rows = grid->rows;
    int columns = grid->columns;
    int size = GRID_ELEMENT_SIZE;
    int borderSize = GRID_BORDER_SIZE;
    Image img = new Colori[(rows * size) * (columns * size)];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            NODE_STATE state = grid->get_node_from_position(x, y)->state;
            Colorf col(0.0f);
            switch (state)
            {
            case EMPTY:
                col = EMPTY_COLOR;
                break;
            case BLOCKED:
                col = BLOCKED_COLOR;
                break;
            case ORIGIN:
                col = ORIGIN_COLOR;
                break;
            case TARGET:
                col = TARGET_COLOR;
                break;
            case PATH:
                col = PATH_COLOR;
                break;
            case CHECKED:
#if SHOW_PATH_LIST
                col = CHECK_COLOR;
#else
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
#endif
                break;
            case NEIGHBOUR:
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
                break;
            }
            int startX = x * size;
            int startY = y * size;
            for (int newY = 0; newY < size; newY++)
            {
                for (int newX = 0; newX < size; newX++)
                {
                    int index = (startY + newY) * (columns * size) + (startX + newX);
                    if (newY < borderSize / 2 || newY >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else if (newX < borderSize / 2 || newX >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else
                    {
                        img[index] = get_color(col);
                    }
                }
            }
        }
    }
    return img;
}